

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string.hpp
# Opt level: O3

string * util::slugize_str(string *__return_storage_ptr__,string *__str)

{
  pointer pcVar1;
  size_t __n;
  string *psVar2;
  pointer pbVar3;
  pointer pbVar4;
  char cVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  size_type sVar9;
  size_type extraout_RDX;
  char *__s1;
  size_type *psVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _words;
  long *local_d8 [2];
  long local_c8 [2];
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  size_t local_78;
  string local_70;
  string local_50;
  
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  pcVar1 = (__str->_M_dataplus)._M_p;
  local_98 = __return_storage_ptr__;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + __str->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[^A-Za-z0-9]","");
  split(&local_90,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
    pcVar1 = (__str->_M_dataplus)._M_p;
    paVar7 = &__str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar7) {
      uVar8 = *(undefined8 *)((long)&__str->field_2 + 8);
      (local_98->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      *(undefined8 *)((long)&local_98->field_2 + 8) = uVar8;
    }
    else {
      (local_98->_M_dataplus)._M_p = pcVar1;
      (local_98->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    psVar10 = &__str->_M_string_length;
    local_98->_M_string_length = __str->_M_string_length;
    (__str->_M_dataplus)._M_p = (pointer)paVar7;
  }
  else {
    uVar13 = 0;
    do {
      __s1 = local_90.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p;
      cVar5 = *__s1;
      if (cVar5 != '\0') {
        lVar11 = 1;
        pcVar12 = __s1;
        do {
          iVar6 = tolower((int)cVar5);
          *pcVar12 = (char)iVar6;
          __s1 = local_90.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p;
          pcVar12 = __s1 + lVar11;
          cVar5 = __s1[lVar11];
          lVar11 = lVar11 + 1;
        } while (cVar5 != '\0');
      }
      pbVar4 = local_90.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_90.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __n = local_90.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_string_length;
      if (__n != 0) {
        lVar11 = (long)local_90.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_90.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(lVar11 >> 5) <= uVar13) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar13);
          sVar9 = extraout_RDX;
          goto LAB_001068c1;
        }
        local_78 = (local_90.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
        if ((((__n == local_78) &&
             (iVar6 = bcmp(__s1,((local_90.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,__n)
             , lVar11 == 0x20)) && (iVar6 == 0)) ||
           ((__n == pbVar4[-1]._M_string_length &&
            (iVar6 = bcmp(__s1,pbVar4[-1]._M_dataplus._M_p,__n), iVar6 == 0)))) {
          std::__cxx11::string::_M_append((char *)&local_b8,(ulong)__s1);
        }
        else {
          if ((__n == local_78) && (iVar6 = bcmp(__s1,(pbVar3->_M_dataplus)._M_p,__n), iVar6 == 0))
          {
            local_d8[0] = local_c8;
            std::__cxx11::string::_M_construct<char*>((string *)local_d8,__s1,__s1 + __n);
            std::__cxx11::string::append((char *)local_d8);
            std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8[0]);
          }
          else {
            local_d8[0] = local_c8;
            std::__cxx11::string::_M_construct<char*>((string *)local_d8,__s1,__s1 + __n);
            std::__cxx11::string::append((char *)local_d8);
            std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8[0]);
          }
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],local_c8[0] + 1);
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)local_90.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_90.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
    if (local_b8._M_p[local_b0 - 1] == '-') {
      sVar9 = local_b0 - 1;
      if (local_b0 == 0) {
LAB_001068c1:
        uVar8 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase",sVar9,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p,
                          CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) +
                          1);
        }
        _Unwind_Resume(uVar8);
      }
      local_b8._M_p[sVar9] = '\0';
      local_b0 = sVar9;
    }
    psVar10 = &local_b0;
    paVar7 = &local_a8;
    (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p == paVar7) {
      (local_98->field_2)._M_allocated_capacity =
           CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]);
      *(undefined8 *)((long)&local_98->field_2 + 8) = local_a8._8_8_;
    }
    else {
      (local_98->_M_dataplus)._M_p = local_b8._M_p;
      (local_98->field_2)._M_allocated_capacity =
           CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]);
    }
    local_98->_M_string_length = local_b0;
    local_b8._M_p = (pointer)paVar7;
  }
  psVar2 = local_98;
  *psVar10 = 0;
  paVar7->_M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  return psVar2;
}

Assistant:

std::string slugize_str(std::string __str) {
		std::string _slug;
		std::vector<std::string> _words = split(__str, "[^A-Za-z0-9]");

		if (_words.empty())
			return __str;
		
		for (int _word_index = 0; (unsigned int) _word_index < _words.size(); _word_index++) {
			for (int _char_index = 0; _words[_word_index][_char_index]; _char_index++)
				_words[_word_index][_char_index] = tolower(_words[_word_index][_char_index]);

			if (_words[_word_index].empty())
				continue;
			else if ((_words.at(_word_index) == _words.front() && _words.size() == 1) || _words.at(_word_index) == _words.back())
				_slug += _words[_word_index];
			else if (_words.at(_word_index) == _words.front())
				_slug += _words[_word_index] + "-";
			else
				_slug += _words[_word_index] + "-";
		}

		// in case the last caught member is a non-alphanumeric character
		if (_slug.back() == '-')
			_slug.erase(_slug.size() - 1);

		return _slug;
	}